

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

string * __thiscall hdc::Driver::getEnvPath(string *__return_storage_ptr__,Driver *this,string *key)

{
  char *pcVar1;
  char *__s;
  
  __s = getenv((key->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__);
  if (__s != (char *)0x0) {
    pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)__s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Driver::getEnvPath(std::string key) {
    char * val;
    val = std::getenv( key.c_str() );
    std::string retval = "";

    if (val != NULL) {
        retval = val;
    }

    return retval;
}